

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O0

void __thiscall CSocekt::flyd_wait_request_handler_proc_plast(CSocekt *this,lp_connection_t c)

{
  long in_RSI;
  CLogicSocket **in_RDI;
  function<void_()> tCall;
  int irmqc;
  int *in_stack_00000f60;
  char *in_stack_00000f68;
  CSocekt *in_stack_00000f70;
  function<void_()> *__x;
  function<void_()> *this_00;
  Task *in_stack_ffffffffffffff78;
  ThreadPool *in_stack_ffffffffffffff80;
  undefined1 local_50 [60];
  undefined4 local_14;
  long local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  inMsgRecvQueue(in_stack_00000f70,in_stack_00000f68,in_stack_00000f60);
  __x = (function<void_()> *)local_50;
  std::bind<void(CLogicSocket::*)(),CLogicSocket*>((offset_in_CLogicSocket_to_subr *)__x,in_RDI);
  this_00 = (function<void_()> *)(local_50 + 0x18);
  std::function<void()>::function<std::_Bind<void(CLogicSocket::*(CLogicSocket*))()>,void>
            (this_00,(_Bind<void_(CLogicSocket::*(CLogicSocket_*))()> *)__x);
  std::function<void_()>::function(this_00,__x);
  muduo::ThreadPool::run(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::function<void_()>::~function((function<void_()> *)0x140807);
  *(undefined1 *)(local_10 + 0xa0) = 0;
  *(undefined8 *)(local_10 + 0xa8) = 0;
  *(undefined1 *)(local_10 + 0x6c) = 0;
  *(long *)(local_10 + 0x88) = local_10 + 0x6d;
  *(int *)(local_10 + 0x90) = (int)in_RDI[1];
  std::function<void_()>::~function((function<void_()> *)0x140876);
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler_proc_plast(lp_connection_t c)
{
    //把这段内存放到消息队列中来；
   // inMsgRecvQueue(c->pnewMemPointer);
    //......这里可能考虑触发业务逻辑，怎么触发业务逻辑，这个代码以后再考虑扩充。。。。。。

    int irmqc = 0; //表示消息队列当前信息数量
    inMsgRecvQueue(c->pnewMemPointer, irmqc);

    std::function<void ()> tCall = std::bind(&CLogicSocket::threadRecvProcFunc,
                                            &g_socket);

    g_threadpool.run(tCall);

    c->ifnewrecvMem    = false;            //内存不再需要释放，因为你收完整了包，这个包被上边调用inMsgRecvQueue()移入消息队列，那么释放内存就属于业务逻辑去干，不需要回收连接到连接池中干了
    c->pnewMemPointer  = NULL;
    c->curStat         = _PKG_HD_INIT;     //收包状态机的状态恢复为原始态，为收下一个包做准备
    c->precvbuf        = c->dataHeadInfo;  //设置好收包的位置
    c->irecvlen        = m_iLenPkgHeader;  //设置好要接收数据的大小
    return;
}